

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Browser.cxx
# Opt level: O1

int __thiscall Fl_File_Browser::item_width(Fl_File_Browser *this,void *p)

{
  char cVar1;
  int *piVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  char *__s;
  double dVar11;
  char fragment [10240];
  char local_2838 [10248];
  
  piVar2 = (this->super_Fl_Browser).column_widths_;
  __s = (char *)((long)p + 0x23);
  sVar4 = strlen(__s);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,
             (ulong)((uint)(*(char *)(sVar4 + 0x22 + (long)p) == '/') |
                    (this->super_Fl_Browser).super_Fl_Browser_.textfont_),
             (ulong)(uint)(this->super_Fl_Browser).super_Fl_Browser_.textsize_);
  pcVar5 = strchr(__s,10);
  if ((pcVar5 != (char *)0x0) ||
     (pcVar5 = strchr(__s,(int)(this->super_Fl_Browser).column_char_), pcVar5 != (char *)0x0)) {
    iVar10 = 0;
    iVar9 = 0;
    uVar6 = 0;
    pcVar5 = local_2838;
    do {
      cVar1 = *__s;
      if (cVar1 == '\n') {
        *pcVar5 = '\0';
        dVar11 = fl_width(local_2838);
        if (iVar10 < iVar9 + (int)dVar11) {
          iVar10 = iVar9 + (int)dVar11;
        }
        iVar9 = 0;
        uVar6 = 0;
        pcVar5 = local_2838;
      }
      else {
        if (cVar1 == '\0') goto LAB_001ace31;
        iVar3 = (int)uVar6;
        if (cVar1 == (this->super_Fl_Browser).column_char_) {
          uVar8 = iVar3 + 1;
          uVar6 = (ulong)uVar8;
          if (piVar2 == (int *)0x0) {
            iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
            iVar9 = (int)((double)iVar3 * 0.6 * 8.0) * uVar8;
          }
          else if (iVar3 < 0) {
            iVar9 = 0;
          }
          else {
            uVar7 = 0;
            iVar9 = 0;
            do {
              iVar3 = piVar2[uVar7];
              if (iVar3 == 0) break;
              iVar9 = iVar9 + iVar3;
              uVar7 = uVar7 + 1;
            } while (uVar6 != uVar7);
          }
          pcVar5 = local_2838;
          if (iVar10 < iVar9) {
            iVar10 = iVar9;
          }
        }
        else {
          *pcVar5 = cVar1;
          pcVar5 = pcVar5 + 1;
        }
      }
      __s = __s + 1;
    } while( true );
  }
  dVar11 = fl_width(__s);
  iVar3 = (int)dVar11;
LAB_001ace67:
  iVar10 = 0;
  if (Fl_File_Icon::first_ != (Fl_File_Icon *)0x0) {
    iVar10 = this->iconsize_ + 8;
  }
  return iVar10 + iVar3 + 2;
LAB_001ace31:
  iVar3 = iVar10;
  if (local_2838 < pcVar5) {
    *pcVar5 = '\0';
    dVar11 = fl_width(local_2838);
    iVar3 = iVar9 + (int)dVar11;
    if (iVar9 + (int)dVar11 <= iVar10) {
      iVar3 = iVar10;
    }
  }
  goto LAB_001ace67;
}

Assistant:

int					// O - Width in pixels
Fl_File_Browser::item_width(void *p) const	// I - List item data
{
  int		i;			// Looping var
  FL_BLINE	*line;			// Pointer to line
  char		*t,			// Pointer into text
		*ptr,			// Pointer into fragment
		fragment[10240];	// Fragment of text
  int		width,			// Width of line
		tempwidth;		// Width of fragment
  int		column;			// Current column
  const int	*columns;		// Columns


  // Scan for newlines...
  line    = (FL_BLINE *)p;
  columns = column_widths();

  // Set the font and size...
  if (line->txt[strlen(line->txt) - 1] == '/')
    fl_font(textfont() | FL_BOLD, textsize());
  else
    fl_font(textfont(), textsize());

  if (strchr(line->txt, '\n') == NULL &&
      strchr(line->txt, column_char()) == NULL)
  {
    // Do a fast width calculation...
    width = (int)fl_width(line->txt);
  }
  else
  {
    // More than 1 line or have columns; find the maximum width...
    width     = 0;
    tempwidth = 0;
    column    = 0;

    for (t = line->txt, ptr = fragment; *t != '\0'; t ++)
      if (*t == '\n')
      {
        // Newline - nul terminate this fragment and get the width...
        *ptr = '\0';

	tempwidth += (int)fl_width(fragment);

        // Update the max width as needed...
	if (tempwidth > width)
	  width = tempwidth;

        // Point back to the start of the fragment...
	ptr       = fragment;
	tempwidth = 0;
	column    = 0;
      }
      else if (*t == column_char())
      {
        // Advance to the next column...
        column ++;
	if (columns)
	{
	  for (i = 0, tempwidth = 0; i < column && columns[i]; i ++)
	    tempwidth += columns[i];
	}
	else
          tempwidth = column * (int)(fl_height() * 0.6 * 8.0);

        if (tempwidth > width)
	  width = tempwidth;

	ptr = fragment;
      }
      else
        *ptr++ = *t;

    if (ptr > fragment)
    {
      // Nul terminate this fragment and get the width...
      *ptr = '\0';

      tempwidth += (int)fl_width(fragment);

      // Update the max width as needed...
      if (tempwidth > width)
	width = tempwidth;
    }
  }

  // If we have enabled icons then add space for them...
  if (Fl_File_Icon::first() != NULL)
    width += iconsize_ + 8;

  // Add space for the selection border..
  width += 2;

  // Return the width
  return (width);
}